

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

void __thiscall
pbrt::PaddedSobolSampler::PaddedSobolSampler
          (PaddedSobolSampler *this,int spp,RandomizeStrategy randomizer)

{
  uint uVar1;
  string ret;
  int local_34;
  string local_30;
  
  uVar1 = (int)(spp - 1U) >> 1 | spp - 1U;
  uVar1 = (int)uVar1 >> 2 | uVar1;
  uVar1 = (int)uVar1 >> 4 | uVar1;
  uVar1 = (int)uVar1 >> 8 | uVar1;
  this->samplesPerPixel = ((int)uVar1 >> 0x10 | uVar1) + 1;
  this->randomizeStrategy = randomizer;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->sampleIndex = 0;
  this->dimension = 0;
  if (POPCOUNT(spp) != 1) {
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_34 = spp;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    detail::stringPrintfRecursive<int&,int&>
              (&local_30,"Pixel samples being rounded up to power of 2 (from %d to %d).",&local_34,
               &this->samplesPerPixel);
    Warning((FileLoc *)0x0,local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                               local_30.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

PaddedSobolSampler::PaddedSobolSampler(int spp, RandomizeStrategy randomizer)
    : samplesPerPixel(RoundUpPow2(spp)), randomizeStrategy(randomizer) {
    if (!IsPowerOf2(spp))
        Warning("Pixel samples being rounded up to power of 2 (from %d to %d).", spp,
                samplesPerPixel);
}